

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall choc::value::Value::addArrayElement<choc::value::Value>(Value *this,Value *v)

{
  Content *pCVar1;
  ComplexArray *other;
  undefined8 __ptr;
  Allocator *pAVar2;
  Object *pOVar3;
  Object *this_00;
  Type local_78;
  ValueView local_58;
  
  local_78.mainType = (v->value).type.mainType;
  pCVar1 = &(v->value).type.content;
  local_78.content.object = (Object *)0x0;
  local_78.allocator = (Allocator *)0x0;
  if (local_78.mainType == object) {
    pOVar3 = pCVar1->object;
    this_00 = (Object *)malloc(0x28);
    Type::Object::Object(this_00,(Allocator *)0x0,pOVar3);
    local_78.content.object = this_00;
  }
  else if (local_78.mainType == complexArray) {
    other = pCVar1->complexArray;
    pOVar3 = (Object *)malloc(0x18);
    Type::ComplexArray::ComplexArray((ComplexArray *)pOVar3,(Allocator *)0x0,other);
    local_78.content._0_8_ = pOVar3;
  }
  else {
    local_78.content._8_8_ = *(undefined8 *)((long)&(v->value).type.content + 8);
    local_78.content.object = pCVar1->object;
  }
  Type::addArrayElements(&(this->value).type,&local_78,1);
  pAVar2 = local_78.allocator;
  __ptr = local_78.content.object;
  if ((char)local_78.mainType < '\0') {
    if (local_78.mainType == object) {
      if (local_78.content.object == (Object *)0x0) goto LAB_001cee3e;
      Type::Object::~Object(local_78.content.object);
    }
    else {
      if ((local_78.mainType != complexArray) || (local_78.content.object == (Object *)0x0))
      goto LAB_001cee3e;
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_78.content.object);
    }
    if (pAVar2 == (Allocator *)0x0) {
      free((void *)__ptr);
    }
    else {
      (**(code **)(*(long *)pAVar2 + 0x20))(pAVar2,__ptr);
    }
  }
LAB_001cee3e:
  ValueView::ValueView(&local_58,&v->value);
  appendValue(this,&local_58);
  if ((char)local_58.type.mainType < '\0') {
    if (local_58.type.mainType == object) {
      if (local_58.type.content.object == (Object *)0x0) {
        return;
      }
      Type::Object::~Object(local_58.type.content.object);
    }
    else {
      if (local_58.type.mainType != complexArray) {
        return;
      }
      if (local_58.type.content.object == (Object *)0x0) {
        return;
      }
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_58.type.content.object);
    }
    if (local_58.type.allocator == (Allocator *)0x0) {
      free(local_58.type.content.object);
    }
    else {
      (**(code **)(*(long *)local_58.type.allocator + 0x20))
                (local_58.type.allocator,local_58.type.content.object);
    }
  }
  return;
}

Assistant:

void Value::addArrayElement (ElementType v)
{
    static_assert (isPrimitiveType<ElementType>() || isValueType<ElementType>() || isStringType<ElementType>(),
                   "The template type needs to be one of the supported primitive types");

    if constexpr (matchesType<ElementType, int32_t>())   { value.type.addArrayElements (Type::createInt32(),   1); appendData (std::addressof (v), sizeof (v)); return; }
    if constexpr (matchesType<ElementType, int64_t>())   { value.type.addArrayElements (Type::createInt64(),   1); appendData (std::addressof (v), sizeof (v)); return; }
    if constexpr (matchesType<ElementType, float>())     { value.type.addArrayElements (Type::createFloat32(), 1); appendData (std::addressof (v), sizeof (v)); return; }
    if constexpr (matchesType<ElementType, double>())    { value.type.addArrayElements (Type::createFloat64(), 1); appendData (std::addressof (v), sizeof (v)); return; }
    if constexpr (matchesType<ElementType, bool>())      { value.type.addArrayElements (Type::createBool(),    1); uint8_t b = v ? 1 : 0; appendData (std::addressof (b), sizeof (b)); return; }

    if constexpr (isStringType<ElementType>())
    {
        value.type.addArrayElements (Type::createString(), 1);
        auto stringHandle = dictionary.getHandleForString (v);
        return appendData (std::addressof (stringHandle.handle), sizeof (stringHandle.handle));
    }

    if constexpr (isValueType<ElementType>())
    {
        value.type.addArrayElements (v.getType(), 1);
        return appendValue (v);
    }
}